

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int do_sign_async(ptls_buffer_t *outbuf,ptls_async_job_t **_async)

{
  undefined4 uVar1;
  async_sign_ctx *async;
  int local_1c;
  ptls_async_job_t *local_18;
  
  local_18 = *_async;
  uVar1 = ASYNC_start_job(local_18 + 2,local_18[1].set_completion_callback,&local_1c,
                          do_sign_async_job,&local_18,8);
  switch(uVar1) {
  default:
    local_1c = 0x203;
    break;
  case 2:
    return 0x20b;
  case 3:
    local_18[2].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)0x0;
    local_1c = ptls_buffer__do_pushv
                         (outbuf,&local_18[2].set_completion_callback,(size_t)local_18[2].get_fd);
  }
  async_sign_ctx_free(local_18);
  *_async = (ptls_async_job_t *)0x0;
  return local_1c;
}

Assistant:

static int do_sign_async(ptls_buffer_t *outbuf, ptls_async_job_t **_async)
{
    struct async_sign_ctx *async = (void *)*_async;
    int ret;

    switch (ASYNC_start_job(&async->job, async->waitctx, &ret, do_sign_async_job, &async, sizeof(async))) {
    case ASYNC_PAUSE:
        return PTLS_ERROR_ASYNC_OPERATION; // async operation inflight; bail out without getting rid of async context
    case ASYNC_ERR:
        ret = PTLS_ERROR_LIBRARY;
        break;
    case ASYNC_NO_JOBS:
        ret = PTLS_ERROR_LIBRARY;
        break;
    case ASYNC_FINISH:
        async->job = NULL;
        ptls_buffer_pushv(outbuf, async->sig, async->siglen);
        ret = 0;
        break;
    default:
        ret = PTLS_ERROR_LIBRARY;
        break;
    }

Exit:
    async_sign_ctx_free(&async->super);
    *_async = NULL;
    return ret;
}